

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

void __thiscall network_pimpl::remove_client(network_pimpl *this,string *value)

{
  bool bVar1;
  const_iterator in_RDI;
  iterator it_1;
  iterator it;
  HighFreqDataType *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  byte in_stack_ffffffffffffff57;
  undefined7 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string local_80 [32];
  HighFreqDataType *local_60;
  __normal_iterator<HighFreqDataType_*,_std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_>
  local_58 [2];
  EventDataType *local_48;
  string local_40 [32];
  EventDataType *local_20;
  __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (EventDataType *)
       std::vector<EventDataType,_std::allocator<EventDataType>_>::begin
                 ((vector<EventDataType,_std::allocator<EventDataType>_> *)in_stack_ffffffffffffff48
                 );
  while( true ) {
    local_20 = (EventDataType *)
               std::vector<EventDataType,_std::allocator<EventDataType>_>::end
                         ((vector<EventDataType,_std::allocator<EventDataType>_> *)
                          in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (__normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
    ::operator->(local_18);
    EventDataType::getOrigin_abi_cxx11_((EventDataType *)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff67 =
         std::operator==(in_stack_ffffffffffffff70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_RDI._M_current);
    std::__cxx11::string::~string(local_40);
    if ((in_stack_ffffffffffffff67 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
      ::operator++(local_18);
    }
    else {
      __gnu_cxx::
      __normal_iterator<EventDataType_const*,std::vector<EventDataType,std::allocator<EventDataType>>>
      ::__normal_iterator<EventDataType*>
                ((__normal_iterator<const_EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 (__normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
                  *)in_stack_ffffffffffffff48);
      local_48 = (EventDataType *)
                 std::vector<EventDataType,_std::allocator<EventDataType>_>::erase
                           ((vector<EventDataType,_std::allocator<EventDataType>_> *)
                            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            (const_iterator)in_RDI._M_current);
      local_18[0]._M_current = local_48;
    }
  }
  local_58[0]._M_current =
       (HighFreqDataType *)
       std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::begin
                 (in_stack_ffffffffffffff48);
  while( true ) {
    local_60 = (HighFreqDataType *)
               std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::end
                         ((vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *)
                          in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HighFreqDataType_*,_std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (__normal_iterator<HighFreqDataType_*,_std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<HighFreqDataType_*,_std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_>
    ::operator->(local_58);
    HighFreqDataType::getOrigin_abi_cxx11_(in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff57 =
         std::operator==(in_stack_ffffffffffffff70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_RDI._M_current);
    std::__cxx11::string::~string(local_80);
    if ((in_stack_ffffffffffffff57 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<HighFreqDataType_*,_std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_>
      ::operator++(local_58);
    }
    else {
      in_stack_ffffffffffffff48 = (HighFreqDataType *)&in_RDI._M_current[1].name;
      __gnu_cxx::
      __normal_iterator<HighFreqDataType_const*,std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>>
      ::__normal_iterator<HighFreqDataType*>
                ((__normal_iterator<const_HighFreqDataType_*,_std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 (__normal_iterator<HighFreqDataType_*,_std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>_>
                  *)in_stack_ffffffffffffff48);
      local_58[0]._M_current =
           (HighFreqDataType *)
           std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::erase
                     ((vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *)
                      CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_RDI);
    }
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
          (key_type *)in_stack_ffffffffffffff48);
  return;
}

Assistant:

void network_pimpl::remove_client(const std::string &value){
    //First remove all events and hfdt's related to this client
    for(auto it = events.begin(); it != events.end(); ){
        if(it->getOrigin() == value)
            it = events.erase(it);
        else ++it;
    }
    //Remove hfdt's
    for(auto it = hfdts.begin(); it != hfdts.end(); ){
        if(it->getOrigin() == value)
            it = hfdts.erase(it);
        else ++it;
    }
    //Remove name from clients
    clients.erase(value);
}